

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float32_to_float64_ppc(float32 a,float_status *s)

{
  _Bool _Var1;
  int iVar2;
  union_float64 ud;
  union_float32 uf;
  float_status *s_local;
  double dStack_10;
  float32 a_local;
  
  _Var1 = float32_is_normal(a);
  if (_Var1) {
    dStack_10 = (double)(float)a;
  }
  else {
    iVar2 = float32_is_zero(a);
    if (iVar2 == 0) {
      dStack_10 = (double)soft_float32_to_float64(a,s);
    }
    else {
      iVar2 = float32_is_neg(a);
      dStack_10 = (double)float64_set_sign(0,iVar2);
    }
  }
  return (float64)dStack_10;
}

Assistant:

float64 float32_to_float64(float32 a, float_status *s)
{
    if (likely(float32_is_normal(a))) {
        /* Widening conversion can never produce inexact results.  */
        union_float32 uf;
        union_float64 ud;
        uf.s = a;
        ud.h = uf.h;
        return ud.s;
    } else if (float32_is_zero(a)) {
        return float64_set_sign(float64_zero, float32_is_neg(a));
    } else {
        return soft_float32_to_float64(a, s);
    }
}